

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::PlainSkipTemplated<duckdb::DecimalParquetValueConversion<int,false>>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values)

{
  bool bVar1;
  uint8_t *in_RCX;
  ByteBuffer *in_RDX;
  ColumnReader *in_RSI;
  uint64_t in_RDI;
  
  bVar1 = HasDefines((ColumnReader *)0x862ac6);
  if ((bVar1) && (in_RDX != (ByteBuffer *)0x0)) {
    PlainSkipTemplatedDefines<duckdb::DecimalParquetValueConversion<int,false>,true>
              (in_RSI,in_RDX,in_RCX,in_RDI);
  }
  else {
    PlainSkipTemplatedDefines<duckdb::DecimalParquetValueConversion<int,false>,false>
              (in_RSI,in_RDX,in_RCX,in_RDI);
  }
  return;
}

Assistant:

void PlainSkipTemplated(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values) {
		if (HasDefines() && defines) {
			PlainSkipTemplatedDefines<CONVERSION, true>(plain_data, defines, num_values);
		} else {
			PlainSkipTemplatedDefines<CONVERSION, false>(plain_data, defines, num_values);
		}
	}